

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

ON__UINT32 __thiscall ON_RevSurface::DataCRC(ON_RevSurface *this,ON__UINT32 current_remainder)

{
  ON__UINT32 OVar1;
  ON__UINT32 local_14;
  ON__UINT32 current_remainder_local;
  ON_RevSurface *this_local;
  
  local_14 = current_remainder;
  if (this->m_curve != (ON_Curve *)0x0) {
    local_14 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[9])
                         (this->m_curve,(ulong)current_remainder);
  }
  OVar1 = ON_CRC32(local_14,0x30,&this->m_axis);
  OVar1 = ON_CRC32(OVar1,0x10,&this->m_angle);
  OVar1 = ON_CRC32(OVar1,0x10,&this->m_t);
  OVar1 = ON_CRC32(OVar1,1,&this->m_bTransposed);
  return OVar1;
}

Assistant:

ON__UINT32 ON_RevSurface::DataCRC(ON__UINT32 current_remainder) const
{
  if ( m_curve )
    current_remainder = m_curve->DataCRC(current_remainder);
  current_remainder = ON_CRC32(current_remainder,sizeof(m_axis),&m_axis);
  current_remainder = ON_CRC32(current_remainder,sizeof(m_angle),&m_angle);
  current_remainder = ON_CRC32(current_remainder,sizeof(m_t),&m_t);
  current_remainder = ON_CRC32(current_remainder,sizeof(m_bTransposed),&m_bTransposed);
  return current_remainder;
}